

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O0

void __thiscall HEkkDualRHS::createInfeasList(HEkkDualRHS *this,double columnDensity)

{
  double dVar1;
  long lVar2;
  long lVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  double *pdVar7;
  long *in_RDI;
  double in_XMM0_Qa;
  double *__nth;
  HighsInt iRow_3;
  HighsInt i;
  HighsInt fullCount;
  HighsInt iRow_2;
  double cutMerit;
  double myMerit;
  HighsInt iPut;
  HighsInt iRow_1;
  double maxMerit;
  HighsInt icutoff;
  vector<double,_std::allocator<double>_> *edge_weight;
  HighsInt iRow;
  double *dwork;
  HighsInt numRow;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar8;
  undefined8 in_stack_ffffffffffffff38;
  value_type vVar9;
  double *in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff50;
  uint uVar10;
  int in_stack_ffffffffffffff54;
  int local_98;
  int local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  int local_68;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  int local_44;
  double local_40;
  double local_38;
  vector<double,_std::allocator<double>_> *local_30;
  int local_28;
  undefined4 local_24;
  double *local_20;
  int local_14;
  double local_10;
  
  local_14 = *(int *)(*in_RDI + 0x219c);
  local_10 = in_XMM0_Qa;
  local_20 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x798c14);
  std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x798c2a);
  local_24 = 0;
  std::fill_n<char*,int,int>
            ((char *)in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
             (int *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  *(undefined4 *)(in_RDI + 2) = 0;
  in_RDI[1] = 0;
  for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_28);
    if ((*pvVar4 != 0.0) || (NAN(*pvVar4))) {
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),(long)local_28);
      *pvVar5 = '\x01';
      lVar2 = in_RDI[2];
      *(int *)(in_RDI + 2) = (int)lVar2 + 1;
      in_stack_ffffffffffffff54 = local_28;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)(int)lVar2);
      *pvVar6 = in_stack_ffffffffffffff54;
    }
  }
  local_30 = (vector<double,_std::allocator<double>_> *)(*in_RDI + 0x2a20);
  __nth = (double *)(double)(int)in_RDI[2];
  local_38 = (double)local_14 * 0.01;
  local_40 = 500.0;
  pdVar7 = std::max<double>(&local_38,&local_40);
  uVar10 = in_stack_ffffffffffffff50 & 0xffffff;
  if (*pdVar7 <= (double)__nth && (double)__nth != *pdVar7) {
    uVar10 = CONCAT13(local_10 < 0.05,(int3)in_stack_ffffffffffffff50);
  }
  if ((char)(uVar10 >> 0x18) != '\0') {
    local_50 = (double)(int)in_RDI[2] * 0.001;
    local_58 = 500.0;
    pdVar7 = std::max<double>(&local_50,&local_58);
    local_44 = (int)*pdVar7;
    local_60 = 0.0;
    local_68 = 0;
    for (local_64 = 0; iVar8 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20), local_64 < local_14;
        local_64 = local_64 + 1) {
      pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                         ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),(long)local_64);
      if (*pvVar5 != '\0') {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_64);
        in_stack_ffffffffffffff40 = (double *)*pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_64);
        local_70 = (double)in_stack_ffffffffffffff40 / *pvVar4;
        if (local_60 < local_70) {
          local_60 = local_70;
        }
        local_20[local_68] = -local_70;
        local_68 = local_68 + 1;
      }
    }
    std::nth_element<double*>
              ((double *)CONCAT44(in_stack_ffffffffffffff54,uVar10),__nth,in_stack_ffffffffffffff40)
    ;
    local_78 = -local_20[local_44];
    local_80 = local_60 * 0.99999;
    local_88 = local_78 * 1.00001;
    pdVar7 = std::min<double>(&local_80,&local_88);
    in_RDI[1] = (long)*pdVar7;
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0x798fcc);
    std::fill_n<char*,int,int>
              ((char *)in_stack_ffffffffffffff40,iVar8,
               (int *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    *(undefined4 *)(in_RDI + 2) = 0;
    for (local_90 = 0; local_90 < local_14; local_90 = local_90 + 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)local_90);
      vVar9 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_90);
      if (*pvVar4 * (double)in_RDI[1] <= vVar9) {
        lVar2 = in_RDI[2];
        *(int *)(in_RDI + 2) = (int)lVar2 + 1;
        iVar8 = local_90;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)(int)lVar2);
        *pvVar6 = iVar8;
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),(long)local_90);
        *pvVar5 = '\x01';
      }
    }
    if ((double)local_44 * 1.5 < (double)(int)in_RDI[2]) {
      lVar2 = in_RDI[2];
      *(int *)(in_RDI + 2) = local_44;
      for (local_98 = local_44; local_98 < (int)lVar2; local_98 = local_98 + 1) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_98);
        iVar8 = *pvVar6;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 9),(long)iVar8);
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)iVar8);
        if (dVar1 <= *pvVar4 * local_78) {
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)(in_RDI + 3),(long)iVar8);
          *pvVar5 = '\0';
        }
        else {
          lVar3 = in_RDI[2];
          *(int *)(in_RDI + 2) = (int)lVar3 + 1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)(int)lVar3);
          *pvVar6 = iVar8;
        }
      }
    }
  }
  if ((double)local_14 * 0.2 < (double)(int)in_RDI[2]) {
    *(int *)(in_RDI + 2) = -local_14;
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

void HEkkDualRHS::createInfeasList(double columnDensity) {
  HighsInt numRow = ekk_instance_.lp_.num_row_;
  double* dwork = ekk_instance_.scattered_dual_edge_weight_.data();

  // 1. Build the full list
  fill_n(workMark.data(), numRow, 0);
  workCount = 0;
  workCutoff = 0;
  for (HighsInt iRow = 0; iRow < numRow; iRow++) {
    if (work_infeasibility[iRow]) {
      workMark[iRow] = 1;
      workIndex[workCount++] = iRow;
    }
  }

  // 2. See if it worth to try to go sparse
  //    (Many candidates, really sparse RHS)
  std::vector<double>& edge_weight = ekk_instance_.dual_edge_weight_;
  if (workCount > max(numRow * 0.01, 500.0) && columnDensity < 0.05) {
    HighsInt icutoff = max(workCount * 0.001, 500.0);
    double maxMerit = 0;
    for (HighsInt iRow = 0, iPut = 0; iRow < numRow; iRow++)
      if (workMark[iRow]) {
        double myMerit = work_infeasibility[iRow] / edge_weight[iRow];
        if (maxMerit < myMerit) maxMerit = myMerit;
        dwork[iPut++] = -myMerit;
      }
    nth_element(dwork, dwork + icutoff, dwork + workCount);
    double cutMerit = -dwork[icutoff];
    workCutoff = min(maxMerit * 0.99999, cutMerit * 1.00001);

    // Create again
    fill_n(workMark.data(), numRow, 0);
    workCount = 0;
    for (HighsInt iRow = 0; iRow < numRow; iRow++) {
      if (work_infeasibility[iRow] >= edge_weight[iRow] * workCutoff) {
        workIndex[workCount++] = iRow;
        workMark[iRow] = 1;
      }
    }

    // Reduce by drop smaller
    if (workCount > icutoff * 1.5) {
      // Firstly take up "icutoff" number of elements
      HighsInt fullCount = workCount;
      workCount = icutoff;
      for (HighsInt i = icutoff; i < fullCount; i++) {
        HighsInt iRow = workIndex[i];
        if (work_infeasibility[iRow] > edge_weight[iRow] * cutMerit) {
          workIndex[workCount++] = iRow;
        } else {
          workMark[iRow] = 0;
        }
      }
    }
  }

  // 3. If there are still too many candidates: disable them
  if (workCount > 0.2 * numRow) {
    workCount = -numRow;
    workCutoff = 0;
  }
}